

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::copyTexImage2D
          (GLContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,int width,
          int height,int border)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  undefined4 extraout_var;
  int *piVar7;
  Enum<int,_2UL> EVar8;
  undefined1 local_200 [8];
  IVec2 offset;
  Enum<int,_2UL> local_1e8;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_24;
  int local_20;
  int y_local;
  int x_local;
  deUint32 internalFormat_local;
  int level_local;
  deUint32 target_local;
  GLContext *this_local;
  
  local_24 = y;
  local_20 = x;
  y_local = internalFormat;
  x_local = level;
  internalFormat_local = target;
  _level_local = this;
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [18])"glCopyTexImage2D(");
    EVar8 = glu::getTextureTargetStr(internalFormat_local);
    local_1d8 = EVar8.m_getName;
    local_1d0 = EVar8.m_value;
    local_1c8[0].m_getName = local_1d8;
    local_1c8[0].m_value = local_1d0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1c8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&x_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    EVar8 = glu::getTextureFormatStr(y_local);
    offset.m_data = (int  [2])EVar8.m_getName;
    local_1e8.m_value = EVar8.m_value;
    local_1e8.m_getName = (GetNameFunc)offset.m_data;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_20);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&height);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&border);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  getReadOffset((GLContext *)local_200);
  iVar5 = (*this->m_context->_vptr_RenderContext[3])();
  dVar4 = internalFormat_local;
  iVar3 = x_local;
  iVar2 = y_local;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar5) + 0x350);
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_200);
  iVar5 = *piVar7 + local_20;
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_200);
  (*pcVar1)(dVar4,iVar3,iVar2,iVar5,*piVar7 + local_24,width,height,border);
  return;
}

Assistant:

void GLContext::copyTexImage2D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int height, int border)
{
	// Don't log offset.
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexImage2D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level << ", "
								  << glu::getTextureFormatStr(internalFormat) << ", "
								  << x << ", " << y << ", "
								  << width << ", " << height
								  << ", " << border << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexImage2D(target, level, internalFormat, offset.x()+x, offset.y()+y, width, height, border);
}